

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void __thiscall
Fossilize::StateRecorder::Impl::push_unregister_locked<VkSampler_T*>
          (Impl *this,VkStructureType sType,VkSampler_T *obj)

{
  iterator *piVar1;
  _Elt_pointer pWVar2;
  WorkItem local_28;
  
  local_28.create_info = (void *)0x0;
  local_28.custom_hash = 0;
  pWVar2 = (this->record_queue).c.
           super__Deque_base<Fossilize::WorkItem,_std::allocator<Fossilize::WorkItem>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  local_28.type = sType;
  local_28.handle = (uint64_t)obj;
  if (pWVar2 == (this->record_queue).c.
                super__Deque_base<Fossilize::WorkItem,_std::allocator<Fossilize::WorkItem>_>._M_impl
                .super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<Fossilize::WorkItem,_std::allocator<Fossilize::WorkItem>_>::
    _M_push_back_aux<Fossilize::WorkItem>(&(this->record_queue).c,&local_28);
  }
  else {
    pWVar2->create_info = (void *)0x0;
    pWVar2->custom_hash = 0;
    *(ulong *)pWVar2 = CONCAT44(local_28._4_4_,sType);
    pWVar2->handle = (uint64_t)obj;
    piVar1 = &(this->record_queue).c.
              super__Deque_base<Fossilize::WorkItem,_std::allocator<Fossilize::WorkItem>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  std::condition_variable::notify_one();
  return;
}

Assistant:

void StateRecorder::Impl::push_unregister_locked(VkStructureType sType, T obj)
{
	record_queue.push({sType, api_object_cast<uint64_t>(obj), nullptr, 0});
	record_cv.notify_one();
}